

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::initializeImGui(GLEngine *this)

{
  ImFontAtlas *this_00;
  uint compressed_ttf_size;
  ImGuiIO *pIVar1;
  uint *compressed_ttf_data;
  ImFontConfig config;
  ImFontConfig local_b0;
  
  (*(this->super_Engine)._vptr_Engine[2])();
  ImGui::CreateContext((ImFontAtlas *)0x0);
  ImGui_ImplGlfw_InitForOpenGL(this->mainWindow,true);
  ImGui_ImplOpenGL3_Init("#version 150");
  pIVar1 = ImGui::GetIO();
  ImFontConfig::ImFontConfig(&local_b0);
  local_b0.OversampleH = 5;
  local_b0.OversampleV = 5;
  this_00 = pIVar1->Fonts;
  compressed_ttf_data = getCousineRegularCompressedData();
  compressed_ttf_size = getCousineRegularCompressedSize();
  ImFontAtlas::AddFontFromMemoryCompressedTTF
            (this_00,compressed_ttf_data,compressed_ttf_size,15.0,&local_b0,(ImWchar *)0x0);
  Engine::setImGuiStyle(&this->super_Engine);
  (this->super_Engine).globalFontAtlas = pIVar1->Fonts;
  return;
}

Assistant:

void GLEngine::initializeImGui() {

  bindDisplay();

  ImGui::CreateContext(); // must call once at start

  // Set up ImGUI glfw bindings
  ImGui_ImplGlfw_InitForOpenGL(mainWindow, true);
  const char* glsl_version = "#version 150";
  ImGui_ImplOpenGL3_Init(glsl_version);

  ImGuiIO& io = ImGui::GetIO();
  ImFontConfig config;
  config.OversampleH = 5;
  config.OversampleV = 5;
  ImFont* font = io.Fonts->AddFontFromMemoryCompressedTTF(getCousineRegularCompressedData(),
                                                          getCousineRegularCompressedSize(), 15.0f, &config);
  // io.OptResizeWindowsFromEdges = true;
  // ImGui::StyleColorsLight();
  setImGuiStyle();

  globalFontAtlas = io.Fonts;
}